

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

string * __thiscall MD5::unparse_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  element_type *peVar1;
  allocator local_49;
  string local_48;
  uchar local_28 [8];
  Digest digest_val;
  MD5 *this_local;
  
  digest_val._8_8_ = this;
  peVar1 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar1->_vptr_QPDFCryptoImpl[5])();
  digest(this,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,(char *)local_28,0x10,&local_49);
  QUtil::hex_encode(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::string
MD5::unparse()
{
    this->crypto->MD5_finalize();
    Digest digest_val;
    digest(digest_val);
    return QUtil::hex_encode(std::string(reinterpret_cast<char*>(digest_val), 16));
}